

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

RPCHelpMan * wallet::getaddressesbylabel(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_03;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  _Manager_type in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9b8;
  pointer in_stack_fffffffffffff9c8;
  pointer pRVar1;
  pointer in_stack_fffffffffffff9d0;
  pointer pRVar2;
  pointer in_stack_fffffffffffff9d8;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9f8 [16];
  pointer in_stack_fffffffffffffa08;
  pointer in_stack_fffffffffffffa10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa28 [16];
  undefined1 in_stack_fffffffffffffa38 [56];
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  char *local_4b8;
  size_type local_4b0;
  char local_4a8 [8];
  undefined8 uStack_4a0;
  string local_498 [32];
  string local_478 [32];
  RPCResult local_458;
  string local_3d0 [32];
  string local_3b0 [32];
  RPCResult local_390;
  string local_308 [32];
  string local_2e8 [32];
  RPCResult local_2c8;
  RPCArgOptions local_240;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"getaddressesbylabel",(allocator<char> *)&stack0xfffffffffffffa67);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"\nReturns the list of addresses assigned the specified label.\n",
             (allocator<char> *)&stack0xfffffffffffffa66);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"label",(allocator<char> *)&stack0xfffffffffffffa47);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"The label.",(allocator<char> *)&stack0xfffffffffffffa46);
  local_240.oneline_description._M_dataplus._M_p = (pointer)&local_240.oneline_description.field_2;
  local_240.skip_type_check = false;
  local_240.oneline_description._M_string_length = 0;
  local_240.oneline_description.field_2._M_local_buf[0] = '\0';
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_240._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff990;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  name.field_2._8_8_ = in_stack_fffffffffffff9a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff9b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff9a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff9b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff9c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff9d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff9d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff9e0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff9e0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff9e0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff9f8;
  description_03._M_string_length = (size_type)in_stack_fffffffffffffa10;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
  description_03.field_2 = in_stack_fffffffffffffa18;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffa38._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa38._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa38._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffffa38[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffffa38[0x31];
  opts._66_6_ = in_stack_fffffffffffffa38._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffffa28[0];
  opts._1_7_ = in_stack_fffffffffffffa28._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa28._8_8_;
  RPCArg::RPCArg(&local_158,name,(Type)local_178,fallback,description_03,opts);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa48,__l,
             (allocator_type *)&stack0xfffffffffffffa45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"",(allocator<char> *)&stack0xfffffffffffffa27);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"json object with addresses as keys",
             (allocator<char> *)&stack0xfffffffffffffa26);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b0,"address",(allocator<char> *)&stack0xfffffffffffffa07);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"json object with information about address",
             (allocator<char> *)&stack0xfffffffffffffa06);
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"purpose",(allocator<char> *)&stack0xfffffffffffff9e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,
             "Purpose of address (\"send\" for sending address, \"receive\" for receiving address)",
             (allocator<char> *)&stack0xfffffffffffff9e6);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff990;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description._M_string_length = in_stack_fffffffffffff9b0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description.field_2 = in_stack_fffffffffffff9b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_458,STR,m_key_name,description,inner,SUB81(local_478,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_458;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9e8,__l_00,
             (allocator_type *)&stack0xfffffffffffff9c7);
  m_key_name_00._M_string_length = in_stack_fffffffffffff990;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description_00._M_string_length = in_stack_fffffffffffff9b0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff9b8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_390,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_3b0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_390;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa08,__l_01,
             (allocator_type *)&stack0xfffffffffffff9c6);
  m_key_name_01._M_string_length = in_stack_fffffffffffff990;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff988;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description_01._M_string_length = in_stack_fffffffffffff9b0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_01.field_2 = in_stack_fffffffffffff9b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_2c8,OBJ_DYN,m_key_name_01,description_01,inner_01,SUB81(local_2e8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff990;
  result._0_8_ = in_stack_fffffffffffff988;
  result.m_key_name._M_string_length = in_stack_fffffffffffff998;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9a0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff9a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9b0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff9b8;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffff9e0;
  result.m_cond._8_16_ = in_stack_fffffffffffff9f8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffa08;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffa28,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"getaddressesbylabel",(allocator<char> *)&stack0xfffffffffffff9c5)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"\"tabby\"",(allocator<char> *)&stack0xfffffffffffff9c4);
  HelpExampleCli(&local_4f8,&local_518,&local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"getaddressesbylabel",(allocator<char> *)&stack0xfffffffffffff9c3)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffa68,"\"tabby\"",
             (allocator<char> *)&stack0xfffffffffffff9c2);
  HelpExampleRpc(&local_558,&local_578,(string *)&stack0xfffffffffffffa68);
  std::operator+(&local_4d8,&local_4f8,&local_558);
  local_4b8 = local_4a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
    uStack_4a0 = local_4d8.field_2._8_8_;
  }
  else {
    local_4b8 = local_4d8._M_dataplus._M_p;
  }
  local_4b0 = local_4d8._M_string_length;
  local_4d8._M_string_length = 0;
  local_4d8.field_2._M_local_buf[0] = '\0';
  description_02._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:686:9)>
       ::_M_invoke;
  description_02._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:686:9)>
                ::_M_manager;
  description_02.field_2 = in_stack_fffffffffffff9b8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa08;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9f8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff9f8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffa10;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffa28._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffa28._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffa18._M_local_buf;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff990,&stack0xfffffffffffff998)),
             description_02,args,(RPCResults)in_stack_fffffffffffff9e0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff998);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa68);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa28);
  RPCResult::~RPCResult(&local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa08);
  RPCResult::~RPCResult(&local_390);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9e8);
  RPCResult::~RPCResult(&local_458);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9c8);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffa48);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_240);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getaddressesbylabel()
{
    return RPCHelpMan{"getaddressesbylabel",
                "\nReturns the list of addresses assigned the specified label.\n",
                {
                    {"label", RPCArg::Type::STR, RPCArg::Optional::NO, "The label."},
                },
                RPCResult{
                    RPCResult::Type::OBJ_DYN, "", "json object with addresses as keys",
                    {
                        {RPCResult::Type::OBJ, "address", "json object with information about address",
                        {
                            {RPCResult::Type::STR, "purpose", "Purpose of address (\"send\" for sending address, \"receive\" for receiving address)"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddressesbylabel", "\"tabby\"")
            + HelpExampleRpc("getaddressesbylabel", "\"tabby\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    const std::string label{LabelFromValue(request.params[0])};

    // Find all addresses that have the given label
    UniValue ret(UniValue::VOBJ);
    std::set<std::string> addresses;
    pwallet->ForEachAddrBookEntry([&](const CTxDestination& _dest, const std::string& _label, bool _is_change, const std::optional<AddressPurpose>& _purpose) {
        if (_is_change) return;
        if (_label == label) {
            std::string address = EncodeDestination(_dest);
            // CWallet::m_address_book is not expected to contain duplicate
            // address strings, but build a separate set as a precaution just in
            // case it does.
            bool unique = addresses.emplace(address).second;
            CHECK_NONFATAL(unique);
            // UniValue::pushKV checks if the key exists in O(N)
            // and since duplicate addresses are unexpected (checked with
            // std::set in O(log(N))), UniValue::pushKVEnd is used instead,
            // which currently is O(1).
            UniValue value(UniValue::VOBJ);
            value.pushKV("purpose", _purpose ? PurposeToString(*_purpose) : "unknown");
            ret.pushKVEnd(address, std::move(value));
        }
    });

    if (ret.empty()) {
        throw JSONRPCError(RPC_WALLET_INVALID_LABEL_NAME, std::string("No addresses with label " + label));
    }

    return ret;
},
    };
}